

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Easy.cpp
# Opt level: O3

void __thiscall curlpp::Easy::setOpt(Easy *this,auto_ptr<curlpp::OptionBase> *option)

{
  OptionBase *option_00;
  
  (**(code **)(**(long **)option + 0x28))(*(long **)option,(this->mCurl)._M_ptr);
  option_00 = *(OptionBase **)option;
  *(undefined8 *)option = 0;
  internal::OptionList::setOpt(&this->mOptions,option_00);
  return;
}

Assistant:

void
curlpp::Easy::setOpt(std::auto_ptr<OptionBase> option)
{
	option->updateHandleToMe(mCurl.get());
	mOptions.setOpt(option.release());    
}